

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::setCurrentIndex(QAbstractItemView *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  undefined4 uVar3;
  ulong uVar4;
  
  lVar1 = *(long *)(this + 8);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 800));
  if (bVar2) {
    bVar2 = QModelIndex::isValid(index);
    if ((bVar2) &&
       (uVar4 = (**(code **)(**(long **)(lVar1 + 0x2f8) + 0x138))(*(long **)(lVar1 + 0x2f8),index),
       (uVar4 & 0x20) == 0)) {
      return;
    }
    uVar3 = (**(code **)(*(long *)this + 0x2e8))(this,index,0);
    (**(code **)(**(long **)(lVar1 + 0x328) + 0x60))(*(long **)(lVar1 + 0x328),index,uVar3);
    *(undefined1 *)(lVar1 + 0x490) = 1;
  }
  return;
}

Assistant:

void QAbstractItemView::setCurrentIndex(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    if (d->selectionModel && (!index.isValid() || d->isIndexEnabled(index))) {
        QItemSelectionModel::SelectionFlags command = selectionCommand(index, nullptr);
        d->selectionModel->setCurrentIndex(index, command);
        d->currentIndexSet = true;
    }
}